

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

bool xercesc_4_0::XMLUri::isValidRegistryBasedAuthority(XMLCh *authority)

{
  bool bVar1;
  int iVar2;
  XMLSize_t XVar3;
  long lVar4;
  bool bVar5;
  
  if (authority == (XMLCh *)0x0) {
    bVar5 = false;
  }
  else {
    while( true ) {
      bVar5 = *authority == L'\0';
      if (bVar5) break;
      bVar1 = isUnreservedCharacter(*authority);
      lVar4 = 2;
      if ((!bVar1) &&
         (iVar2 = XMLString::indexOf((XMLCh *)REG_NAME_CHARACTERS,*authority), iVar2 == -1)) {
        if (*authority != L'%') {
          return bVar5;
        }
        XVar3 = XMLString::stringLen(authority);
        if (XVar3 < 3) {
          return bVar5;
        }
        bVar1 = XMLString::isHex(authority[1]);
        if (!bVar1) {
          return bVar5;
        }
        bVar1 = XMLString::isHex(authority[2]);
        lVar4 = 6;
        if (!bVar1) {
          return bVar5;
        }
      }
      authority = (XMLCh *)((long)authority + lVar4);
    }
  }
  return bVar5;
}

Assistant:

bool XMLUri::isValidRegistryBasedAuthority(const XMLCh* const authority)
{
    // check authority
    if (!authority)
        return false;

    const XMLCh* tmpStr = authority;
    while (*tmpStr)
    {
        if (isUnreservedCharacter(*tmpStr) ||
            (XMLString::indexOf(REG_NAME_CHARACTERS, *tmpStr) != -1))
        {
            tmpStr++;
        }
        else if (*tmpStr == chPercent)               // '%'
        {
            if (XMLString::stringLen(tmpStr) >= 3
                && XMLString::isHex(*(tmpStr + 1))     // 1st hex
                && XMLString::isHex(*(tmpStr + 2)))  // 2nd hex
            {
                tmpStr+=3;
            }
            else
                return false;
        }
        else
            return false;
    } //while

    return true;
}